

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.cpp
# Opt level: O1

void __thiscall Autonomy2::mainLoop(Autonomy2 *this,bool *run)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  double dVar5;
  int iVar6;
  unsigned_short (*pauVar7) [80];
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  pointer pBVar10;
  Autonomy2 *this_00;
  long lVar11;
  int x;
  long lVar12;
  Blob blob;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> commandBlobs;
  list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> blobs;
  Control control;
  bool tFrame [60] [80];
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> local_1358;
  _List_node_base local_1340;
  size_type local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  TripleBuffer<Autonomy2::Blob> *local_1310;
  Control local_1308;
  
  if (*run == true) {
    local_1310 = &this->receivedTargetBuffer;
    do {
      TripleBuffer<unsigned_short[60][80]>::swapBack(&this->buffer);
      pauVar7 = *(this->buffer).back;
      uVar1 = this->thresholdLow;
      uVar2 = this->thresholdHigh;
      lVar11 = 0;
      this_00 = (Autonomy2 *)&stack0xffffffffffffed08;
      do {
        lVar12 = 0;
        do {
          uVar3 = (*(unsigned_short (*) [80])*pauVar7)[lVar12];
          *(bool *)((long)&(this_00->receivedControlBuffer).buffer[0].aileron + lVar12) =
               uVar1 < uVar3 && uVar3 < uVar2;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x50);
        lVar11 = lVar11 + 1;
        this_00 = (Autonomy2 *)
                  ((long)&(this_00->receivedControlBuffer).m.super___mutex_base._M_mutex + 8);
        pauVar7 = pauVar7 + 1;
      } while (lVar11 != 0x3c);
      findBlobs_abi_cxx11_
                ((list<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&local_1340,this_00,
                 (bool (*) [80])&stack0xffffffffffffed08);
      p_Var9 = local_1340._M_next;
      if (local_1330 != 0) {
        p_Var8 = local_1340._M_next;
        for (p_Var9 = (local_1340._M_next)->_M_next; p_Var9 != &local_1340; p_Var9 = p_Var9->_M_next
            ) {
          if (*(int *)&p_Var8[1]._M_prev < *(int *)&p_Var9[1]._M_prev) {
            p_Var8 = p_Var9;
          }
        }
        local_1328 = p_Var8[1]._M_next;
        uStack_1320 = 0;
        iVar4 = *(int *)&p_Var8[1]._M_prev;
        iVar6 = TripleBuffer<Autonomy2::Blob>::swapBackIfReady(local_1310);
        if (iVar6 != 0) {
          dVar5 = (double)iVar4;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          this->targetDist = (float)dVar5;
        }
        std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::vector
                  (&local_1358,local_1330,(allocator_type *)&local_1308);
        p_Var9 = local_1340._M_next;
        pBVar10 = local_1358.super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_1340._M_next != &local_1340) {
          for (; pBVar10 !=
                 local_1358.super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                 _M_impl.super__Vector_impl_data._M_finish; pBVar10 = pBVar10 + 1) {
            pBVar10->x = (int)*(float *)&p_Var9[1]._M_next;
            pBVar10->y = (int)*(float *)((long)&p_Var9[1]._M_next + 4);
            pBVar10->size = *(int *)&p_Var9[1]._M_prev;
            if (p_Var9->_M_next == &local_1340) break;
            p_Var9 = p_Var9->_M_next;
          }
        }
        Sender::sendAutonomyBlobs(this->send,&local_1358);
        Sender::sendAutonomyBlob(this->send,(int)(float)local_1328,(int)local_1328._4_4_);
        blob.size = iVar4;
        blob._0_8_ = local_1328;
        local_1308 = calculateFlightControlsPID(this,blob);
        Sender::sendAutonomyControl(this->send,local_1308);
        ControlArbiter::autonomousControl(this->arbiter,&local_1308);
        p_Var9 = local_1340._M_next;
        if (local_1358.super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1358.
                          super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          p_Var9 = local_1340._M_next;
        }
      }
      while (p_Var9 != &local_1340) {
        p_Var8 = (((_List_base<Autonomy2::Blob,_std::allocator<Autonomy2::Blob>_> *)&p_Var9->_M_next
                  )->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var9);
        p_Var9 = p_Var8;
      }
    } while (*run != false);
  }
  return;
}

Assistant:

void Autonomy2::mainLoop(bool & run) {
  while (run) {
	  buffer.swapBack();
    bool tFrame[ROWS][COLS];
	  threshold(tFrame, buffer.getBack());
    list<Blob> blobs = findBlobs(tFrame);

    // If there exists blobs
    if (blobs.size()) {
      // Calculate target blob
      Blob targetBlob = findLargestBlob(blobs);
      if (receivedTargetBuffer.swapBackIfReady()) {
        // Received target command
        targetDist = sqrt(targetBlob.size);
      }

      // Send all blobs
      vector<Commands::Blob> commandBlobs(blobs.size());
      blobListToCmdBlobVect(commandBlobs, blobs);
      send.sendAutonomyBlobs(commandBlobs);
      send.sendAutonomyBlob(targetBlob.x, targetBlob.y);

      // Calculate Controls
      Control control = calculateFlightControlsPID(targetBlob);
      send.sendAutonomyControl(control);
      arbiter.autonomousControl(control);
    }
  }
}